

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::Session::run(Session *this)

{
  int iVar1;
  Config *config;
  Totals local_48;
  
  iVar1 = 0;
  if ((this->m_configData).showHelp == false) {
    Session::config(this);
    seedRng((IConfig *)(this->m_config).m_p);
    if ((this->m_configData).filenamesAsTags == true) {
      applyFilenamesAsTags((IConfig *)(this->m_config).m_p);
    }
    config = Session::config(this);
    list((Option<unsigned_long> *)&local_48,config);
    if ((int *)local_48.assertions.passed == (int *)0x0) {
      runTests(&local_48,&this->m_config);
      iVar1 = (int)local_48.assertions.failed;
    }
    else {
      iVar1 = *(int *)local_48.assertions.passed;
    }
  }
  return iVar1;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed

                seedRng( *m_config );

                if( m_configData.filenamesAsTags )
                    applyFilenamesAsTags( *m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runTests( m_config ).assertions.failed );
            }
            catch( std::exception& ex ) {
                Catch::cerr() << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }